

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constant.cpp
# Opt level: O2

TIntermTyped * __thiscall
glslang::TIntermediate::foldDereference
          (TIntermediate *this,TIntermTyped *node,int index,TSourceLoc *loc)

{
  int iVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  TTypeList *pTVar3;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TIntermConstantUnion *pTVar4;
  ulong uVar5;
  int start;
  ulong uVar6;
  TType dereferencedType;
  TConstUnionArray local_d8;
  TType local_c8;
  
  iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  start = 0;
  TType::TType(&local_c8,(TType *)CONCAT44(extraout_var,iVar1),index,false);
  local_c8.qualifier._8_8_ = local_c8.qualifier._8_8_ & 0xffffffffffffff80 | 2;
  iVar1 = TType::computeNumComponents(&local_c8);
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  if ((*(byte *)(CONCAT44(extraout_var_00,iVar2) + 10) & 0x60) == 0) {
    iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x2a])(node);
    if (((char)iVar2 == '\0') &&
       (iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x2d])(node), (char)iVar2 != '\0')) {
      iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x2d])(node);
      if ((char)iVar2 == '\0') {
        __assert_fail("node->isStruct()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/Constant.cpp"
                      ,0x4dd,
                      "TIntermTyped *glslang::TIntermediate::foldDereference(TIntermTyped *, int, const TSourceLoc &)"
                     );
      }
      uVar6 = 0;
      uVar5 = (ulong)(uint)index;
      if (index < 1) {
        uVar5 = uVar6;
      }
      start = 0;
      for (; uVar5 * 0x20 != uVar6; uVar6 = uVar6 + 0x20) {
        iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
        pTVar3 = TType::getStruct((TType *)CONCAT44(extraout_var_01,iVar2));
        iVar2 = TType::computeNumComponents
                          (*(TType **)
                            ((long)&((pTVar3->
                                     super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                     ).
                                     super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->type + uVar6));
        start = start + iVar2;
      }
    }
    else {
      start = index * iVar1;
    }
  }
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[5])(node);
  TConstUnionArray::TConstUnionArray
            (&local_d8,(TConstUnionArray *)(CONCAT44(extraout_var_02,iVar2) + 0xb8),start,iVar1);
  iVar1 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x1e])(node);
  pTVar4 = addConstantUnion(this,&local_d8,(TType *)CONCAT44(extraout_var_03,iVar1),loc,false);
  if (pTVar4 != (TIntermConstantUnion *)0x0) {
    (*(pTVar4->super_TIntermTyped).super_TIntermNode._vptr_TIntermNode[0x1d])(pTVar4,&local_c8);
    node = &pTVar4->super_TIntermTyped;
  }
  return &((TIntermConstantUnion *)node)->super_TIntermTyped;
}

Assistant:

TIntermTyped* TIntermediate::foldDereference(TIntermTyped* node, int index, const TSourceLoc& loc)
{
    TType dereferencedType(node->getType(), index);
    dereferencedType.getQualifier().storage = EvqConst;
    TIntermTyped* result = nullptr;
    int size = dereferencedType.computeNumComponents();

    // arrays, vectors, matrices, all use simple multiplicative math
    // while structures need to add up heterogeneous members
    int start;
    if (node->getType().isCoopMat())
        start = 0;
    else if (node->isArray() || ! node->isStruct())
        start = size * index;
    else {
        // it is a structure
        assert(node->isStruct());
        start = 0;
        for (int i = 0; i < index; ++i)
            start += (*node->getType().getStruct())[i].type->computeNumComponents();
    }

    result = addConstantUnion(TConstUnionArray(node->getAsConstantUnion()->getConstArray(), start, size), node->getType(), loc);

    if (result == nullptr)
        result = node;
    else
        result->setType(dereferencedType);

    return result;
}